

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::fill_n<fmt::v11::basic_appender<char>,unsigned_long,char>
          (basic_appender<char> out,unsigned_long count,char *value)

{
  char c;
  basic_appender<char> *this;
  basic_appender<char> local_38;
  char *local_30;
  unsigned_long i;
  char *value_local;
  unsigned_long count_local;
  basic_appender<char> out_local;
  
  i = (unsigned_long)value;
  value_local = (char *)count;
  count_local = (unsigned_long)out.container;
  for (local_30 = (char *)0x0; local_30 < value_local; local_30 = local_30 + 1) {
    c = *(char *)i;
    local_38 = basic_appender<char>::operator++((basic_appender<char> *)&count_local,0);
    this = basic_appender<char>::operator*(&local_38);
    basic_appender<char>::operator=(this,c);
  }
  return (basic_appender<char>)(buffer<char> *)count_local;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}